

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

avector<AffineSpace3ff> * __thiscall
embree::XMLLoader::loadAffineSpace3faArray
          (avector<AffineSpace3ff> *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  Vector *pVVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  XML *this_00;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar13;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar14;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar15;
  pointer pAVar16;
  pointer pAVar17;
  pointer pAVar18;
  bool bVar19;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar20;
  long lVar21;
  size_t sVar22;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar23;
  runtime_error *this_01;
  ulong uVar24;
  XMLLoader *this_02;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  size_t *psVar28;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar29;
  allocator local_f9;
  avector<AffineSpace3ff> *local_f8;
  Ref<embree::XML> *local_f0;
  Ref<embree::XML> child;
  vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
  temp;
  undefined8 uStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8 [3];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  
  local_f8 = __return_storage_ptr__;
  if (xml->ptr == (XML *)0x0) {
    __return_storage_ptr__->size_active = 0;
    __return_storage_ptr__->size_alloced = 0;
    __return_storage_ptr__->items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
  }
  else {
    local_f0 = xml;
    bVar19 = std::operator==(&xml->ptr->name,"AffineSpaceArray");
    if (bVar19) {
      __return_storage_ptr__->items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
      __return_storage_ptr__->size_active = 0;
      __return_storage_ptr__->size_alloced = 0;
      pAVar23 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
      uVar24 = 0;
      uVar25 = 0;
      while( true ) {
        this_02 = (XMLLoader *)local_f0->ptr;
        if ((ulong)((long)((this_02->id2node)._M_t._M_impl.super__Rb_tree_header._M_node_count -
                          (long)(this_02->id2node)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_right) >> 3) <= uVar25) break;
        XML::child((XML *)&child,(size_t)this_02);
        load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
                  ((AffineSpace3fa *)&temp,this_02,&child);
        pAVar18 = temp.
                  super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pAVar17 = temp.
                  super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pAVar16 = temp.
                  super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar1 = uVar25 + 1;
        if (uVar24 <= uVar25) {
          uVar26 = uVar24;
          uVar27 = uVar1;
          if (uVar24 != 0) {
            for (; uVar27 = uVar26, uVar26 <= uVar25; uVar26 = uVar26 * 2 + (ulong)(uVar26 * 2 == 0)
                ) {
            }
          }
          if (uVar24 != uVar27) {
            pAVar20 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                      alignedMalloc(uVar27 << 6,0x10);
            lVar21 = 0x30;
            uVar24 = uVar25;
            while (bVar19 = uVar24 != 0, uVar24 = uVar24 - 1, bVar19) {
              puVar2 = (undefined8 *)((long)pAVar23 + lVar21 + -0x30);
              uVar8 = puVar2[1];
              puVar3 = (undefined8 *)((long)pAVar20 + lVar21 + -0x30);
              *puVar3 = *puVar2;
              puVar3[1] = uVar8;
              puVar2 = (undefined8 *)((long)pAVar23 + lVar21 + -0x20);
              uVar8 = puVar2[1];
              puVar3 = (undefined8 *)((long)pAVar20 + lVar21 + -0x20);
              *puVar3 = *puVar2;
              puVar3[1] = uVar8;
              puVar2 = (undefined8 *)((long)pAVar23 + lVar21 + -0x10);
              uVar8 = puVar2[1];
              puVar3 = (undefined8 *)((long)pAVar20 + lVar21 + -0x10);
              *puVar3 = *puVar2;
              puVar3[1] = uVar8;
              puVar2 = (undefined8 *)((long)&(pAVar23->l).vx.field_0 + lVar21);
              uVar8 = puVar2[1];
              puVar3 = (undefined8 *)((long)&(pAVar20->l).vx.field_0 + lVar21);
              *puVar3 = *puVar2;
              puVar3[1] = uVar8;
              lVar21 = lVar21 + 0x40;
            }
            alignedFree(pAVar23);
            uVar24 = uVar27;
            pAVar23 = pAVar20;
          }
        }
        *(pointer *)&pAVar23[uVar25].l.vx.field_0 = pAVar16;
        *(pointer *)((long)&pAVar23[uVar25].l.vx.field_0 + 8) = pAVar17;
        pVVar4 = &pAVar23[uVar25].l.vy;
        *(pointer *)&pVVar4->field_0 = pAVar18;
        *(undefined8 *)((long)&pVVar4->field_0 + 8) = uStack_b0;
        pVVar4 = &pAVar23[uVar25].l.vz;
        *(undefined8 *)&pVVar4->field_0 = local_a8[0]._M_allocated_capacity;
        *(undefined8 *)((long)&pVVar4->field_0 + 8) = local_a8[0]._8_8_;
        local_78 = (float)local_a8[1]._0_8_;
        fStack_74 = (float)((ulong)local_a8[1]._0_8_ >> 0x20);
        fStack_70 = (float)local_a8[1]._8_8_;
        fStack_6c = (float)((ulong)local_a8[1]._8_8_ >> 0x20);
        pVVar4 = &pAVar23[uVar25].p;
        (pVVar4->field_0).m128[0] = local_78;
        (pVVar4->field_0).m128[1] = fStack_74;
        (pVVar4->field_0).m128[2] = fStack_70;
        (pVVar4->field_0).m128[3] = fStack_6c;
        uVar25 = uVar1;
        if (child.ptr != (XML *)0x0) {
          (*((child.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
      }
      local_f8->size_active = uVar25;
      local_f8->size_alloced = uVar24;
      local_f8->items = pAVar23;
    }
    else {
      this_00 = local_f0->ptr;
      std::__cxx11::string::string((string *)&child,"ofs",&local_f9);
      XML::parm((string *)&temp,this_00,(string *)&child);
      bVar19 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &temp,"");
      std::__cxx11::string::~string((string *)&temp);
      std::__cxx11::string::~string((string *)&child);
      if (!bVar19) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_((string *)&child,&local_f0->ptr->loc);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&child,
                       ": invalid AffineSpace3fa array");
        std::runtime_error::runtime_error(this_01,(string *)&temp);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      loadBinary<std::vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>>>,std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>>>>>>
                (&temp,this,local_f0);
      psVar28 = &__return_storage_ptr__->size_active;
      __return_storage_ptr__->items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
      __return_storage_ptr__->size_active = 0;
      __return_storage_ptr__->size_alloced = 0;
      sVar22 = ((long)temp.
                      super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)temp.
                     super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x30;
      if (temp.
          super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          temp.
          super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pAVar23 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
      }
      else {
        pAVar23 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                  alignedMalloc(sVar22 << 6,0x10);
        __return_storage_ptr__->items = pAVar23;
        alignedFree((void *)0x0);
        *psVar28 = sVar22;
        psVar28 = &__return_storage_ptr__->size_alloced;
      }
      *psVar28 = sVar22;
      paVar29 = &(pAVar23->p).field_0;
      lVar21 = 0x28;
      for (uVar25 = 0;
          uVar25 < (ulong)(((long)temp.
                                  super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)temp.
                                 super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x30);
          uVar25 = uVar25 + 1) {
        uVar8 = *(undefined8 *)
                 ((long)temp.
                        super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar21 + -0x24);
        uVar9 = *(undefined8 *)
                 ((long)temp.
                        super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar21 + -0x18);
        uVar5 = *(undefined4 *)
                 ((long)temp.
                        super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar21 + -0x1c);
        uVar10 = *(undefined8 *)
                  ((long)temp.
                         super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar21 + -0xc);
        uVar6 = *(undefined4 *)
                 ((long)temp.
                        super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar21 + -0x10);
        uVar11 = *(undefined8 *)
                  ((long)&((temp.
                            super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->l).vx.field_0 + lVar21);
        uVar7 = *(undefined4 *)
                 ((long)temp.
                        super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar21 + -4);
        aVar12.m128[1] = (float)(int)uVar8;
        aVar12.m128[0] =
             (float)*(undefined4 *)
                     ((long)temp.
                            super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar21 + -0x28);
        aVar12.m128[2] = (float)(int)((ulong)uVar8 >> 0x20);
        aVar12.m128[3] = 0.0;
        paVar29[-3] = aVar12;
        aVar13.m128[1] = (float)(int)uVar9;
        aVar13.m128[0] = (float)uVar5;
        aVar13.m128[2] = (float)(int)((ulong)uVar9 >> 0x20);
        aVar13.m128[3] = 0.0;
        paVar29[-2] = aVar13;
        aVar14.m128[1] = (float)(int)uVar10;
        aVar14.m128[0] = (float)uVar6;
        aVar14.m128[2] = (float)(int)((ulong)uVar10 >> 0x20);
        aVar14.m128[3] = 0.0;
        paVar29[-1] = aVar14;
        aVar15.m128[1] = (float)(int)uVar11;
        aVar15.m128[0] = (float)uVar7;
        aVar15.m128[2] = (float)(int)((ulong)uVar11 >> 0x20);
        aVar15.m128[3] = 0.0;
        *paVar29 = aVar15;
        lVar21 = lVar21 + 0x30;
        paVar29 = paVar29 + 4;
      }
      std::
      _Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
      ::~_Vector_base(&temp.
                       super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                     );
    }
  }
  return local_f8;
}

Assistant:

avector<AffineSpace3ff> XMLLoader::loadAffineSpace3faArray(const Ref<XML>& xml)
  {
    if (!xml) return avector<AffineSpace3ff>();

    if (xml->name == "AffineSpaceArray") {
      avector<AffineSpace3ff> spaceArray;
      for (size_t i = 0; i < xml->size(); ++i) {
        auto child = xml->child(i);
        AffineSpace3ff space = AffineSpace3ff(load<AffineSpace3fa>(child));
        spaceArray.push_back(space);
      }
      return spaceArray;
    }
    else if (xml->parm("ofs") != "") {
      std::vector<AffineSpace3f> temp = loadBinary<std::vector<AffineSpace3f>>(xml);
      avector<AffineSpace3ff> data; data.resize(temp.size());
      for (size_t i=0; i<temp.size(); i++) data[i] = AffineSpace3ff(AffineSpace3fa(temp[i]));
      return data;
    }
    else
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid AffineSpace3fa array");
  }